

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

_Bool oonf_layer2_net_remove(oonf_layer2_net *l2net,oonf_layer2_origin *origin)

{
  list_entity *plVar1;
  _Bool _Var2;
  bool bVar3;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  oonf_layer2_neigh *poStack_40;
  _Bool changed;
  oonf_layer2_neigh *l2neigh_it;
  oonf_layer2_neigh *l2neigh;
  oonf_layer2_origin *origin_local;
  oonf_layer2_net *l2net_local;
  
  l2net_local._7_1_ = false;
  bVar3 = false;
  if ((l2net->_node).list.next != (list_entity *)0x0) {
    bVar3 = (l2net->_node).list.prev != (list_entity *)0x0;
  }
  if (bVar3) {
    plVar1 = (l2net->neighbors).list_head.next;
    l2neigh_it = (oonf_layer2_neigh *)(plVar1 + -0x4c);
    plVar1 = plVar1->next;
    while (poStack_40 = (oonf_layer2_neigh *)(plVar1 + -0x4c),
          (l2neigh_it->_node).list.prev != (l2net->neighbors).list_head.prev) {
      _Var2 = oonf_layer2_neigh_remove(l2neigh_it,origin);
      if (_Var2) {
        l2net_local._7_1_ = true;
      }
      l2neigh_it = poStack_40;
      plVar1 = plVar1->next;
    }
    _Var2 = oonf_layer2_net_cleanup(l2net,origin,false);
    if (_Var2) {
      l2net_local._7_1_ = true;
    }
    if (l2net_local._7_1_ != false) {
      oonf_layer2_net_commit(l2net);
    }
  }
  else {
    l2net_local._7_1_ = false;
  }
  return l2net_local._7_1_;
}

Assistant:

bool
oonf_layer2_net_remove(struct oonf_layer2_net *l2net, const struct oonf_layer2_origin *origin) {
  struct oonf_layer2_neigh *l2neigh, *l2neigh_it;
  bool changed = false;

  if (!avl_is_node_added(&l2net->_node)) {
    return false;
  }

  avl_for_each_element_safe(&l2net->neighbors, l2neigh, _node, l2neigh_it) {
    if (oonf_layer2_neigh_remove(l2neigh, origin)) {
      changed = true;
    }
  }

  if (oonf_layer2_net_cleanup(l2net, origin, false)) {
    changed = true;
  }

  if (changed) {
    oonf_layer2_net_commit(l2net);
  }
  return changed;
}